

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_dec.cc
# Opt level: O1

int asn1_template_ex_d2i
              (ASN1_VALUE **val,uchar **in,long inlen,ASN1_TEMPLATE *tt,char opt,CRYPTO_BUFFER *buf,
              int depth)

{
  uchar *puVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int line;
  char cst;
  uchar *p;
  long len;
  
  if (val == (ASN1_VALUE **)0x0) {
    return 0;
  }
  p = *in;
  if ((tt->flags & 0x10) == 0) {
    iVar2 = asn1_template_noexp_d2i(val,in,inlen,tt,opt,buf,depth);
    return iVar2;
  }
  uVar3 = asn1_check_tlen(&len,(int *)0x0,(uchar *)0x0,&cst,&p,inlen,tt->tag,tt->flags & 0xc0,opt);
  puVar1 = p;
  uVar4 = (ulong)uVar3;
  iVar2 = 1;
  if (uVar3 != 0xffffffff) {
    if (uVar3 == 0) {
      iVar2 = 0x9e;
      line = 0x1e1;
    }
    else if (cst == '\0') {
      iVar2 = 0x78;
      line = 0x1e7;
    }
    else {
      iVar2 = asn1_template_noexp_d2i(val,&p,len,tt,'\0',buf,depth);
      if (iVar2 != 0) {
        uVar4 = (long)puVar1 - (long)p;
        len = len + uVar4;
        if (len == 0) {
          iVar2 = 0;
        }
        else {
          ERR_put_error(0xc,0,0x77,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                        ,500);
          iVar2 = 2;
        }
        goto LAB_0020c6e7;
      }
      iVar2 = 0x9e;
      line = 0x1ed;
    }
    uVar4 = 0;
    ERR_put_error(0xc,0,iVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,line);
    iVar2 = 1;
  }
LAB_0020c6e7:
  if (iVar2 == 0) {
    *in = p;
    return 1;
  }
  if (iVar2 == 2) {
    ASN1_template_free((ASN1_VALUE **)val,(ASN1_TEMPLATE *)tt);
    return 0;
  }
  return (int)uVar4;
}

Assistant:

static int asn1_template_ex_d2i(ASN1_VALUE **val, const unsigned char **in,
                                long inlen, const ASN1_TEMPLATE *tt, char opt,
                                CRYPTO_BUFFER *buf, int depth) {
  int aclass;
  int ret;
  long len;
  const unsigned char *p, *q;
  if (!val) {
    return 0;
  }
  uint32_t flags = tt->flags;
  aclass = flags & ASN1_TFLG_TAG_CLASS;

  p = *in;

  // Check if EXPLICIT tag expected
  if (flags & ASN1_TFLG_EXPTAG) {
    char cst;
    // Need to work out amount of data available to the inner content and
    // where it starts: so read in EXPLICIT header to get the info.
    ret = asn1_check_tlen(&len, NULL, NULL, &cst, &p, inlen, tt->tag, aclass,
                          opt);
    q = p;
    if (!ret) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
      return 0;
    } else if (ret == -1) {
      return -1;
    }
    if (!cst) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_EXPLICIT_TAG_NOT_CONSTRUCTED);
      return 0;
    }
    // We've found the field so it can't be OPTIONAL now
    ret = asn1_template_noexp_d2i(val, &p, len, tt, /*opt=*/0, buf, depth);
    if (!ret) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
      return 0;
    }
    // We read the field in OK so update length
    len -= p - q;
    // Check for trailing data.
    if (len) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_EXPLICIT_LENGTH_MISMATCH);
      goto err;
    }
  } else {
    return asn1_template_noexp_d2i(val, in, inlen, tt, opt, buf, depth);
  }

  *in = p;
  return 1;

err:
  ASN1_template_free(val, tt);
  return 0;
}